

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,ByteData *signature,SigHashType *sighash_type)

{
  SigHashAlgorithm SVar1;
  uint32_t uVar2;
  CfdException *this;
  SigHashAlgorithm SVar3;
  SigHashAlgorithm SVar4;
  size_t written;
  uint32_t local_a4;
  SigHashType temp_sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  int ret;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ByteData::GetBytes(&sig,signature);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,0x49,(allocator_type *)&temp_sighash);
  written = 0;
  if (output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (-2 - (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) <=
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      -(long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start) {
    temp_sighash.kSigHashForkId = '@';
    temp_sighash.kSigHashRangeproof = '@';
    temp_sighash.kSigHashAnyOneCanPay = 0x80;
    temp_sighash.hash_algorithm_ = kSigHashAll;
    temp_sighash._8_4_ = temp_sighash._8_4_ & 0xffff0000;
    ConvertSignatureFromDer((ByteData *)&local_38,signature,&temp_sighash);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    SVar1 = SigHashType::GetSigHashFlag(sighash_type);
    SVar3 = (SigHashAlgorithm)temp_sighash.kSigHashAnyOneCanPay;
    if (temp_sighash.is_anyone_can_pay_ == false) {
      SVar3 = kSigHashDefault;
    }
    SVar4 = (SigHashAlgorithm)temp_sighash.kSigHashForkId;
    if (temp_sighash.is_fork_id_ == false) {
      SVar4 = kSigHashDefault;
    }
    if ((SVar1 & 0xff) == (SVar4 | SVar3 | temp_sighash.hash_algorithm_)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&__return_storage_ptr__->data_,&signature->data_);
      goto LAB_00351ef8;
    }
  }
  ret = wally_ec_sig_to_der(sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)sig.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)sig.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)output.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)output.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&written);
  if (ret != 0) {
    temp_sighash._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
         + 99;
    temp_sighash.is_anyone_can_pay_ = true;
    temp_sighash.is_fork_id_ = true;
    temp_sighash._10_2_ = 0;
    logger::warn<int&>((CfdSourceLocation *)&temp_sighash,"wally_ec_sig_to_der NG[{}].",&ret);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&temp_sighash,"der encode error.",(allocator *)&local_a4);
    CfdException::CfdException(this,kCfdIllegalStateError,(string *)&temp_sighash);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (written < 0x49) {
    temp_sighash._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
         + 99;
    temp_sighash.is_anyone_can_pay_ = true;
    temp_sighash.is_fork_id_ = true;
    temp_sighash._10_2_ = 0;
    local_a4 = SigHashType::GetSigHashFlag(sighash_type);
    logger::info<unsigned_long&,unsigned_int>
              ((CfdSourceLocation *)&temp_sighash,"size[{}]. append[{}]",&written,&local_a4);
    uVar2 = SigHashType::GetSigHashFlag(sighash_type);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[written] = (uchar)uVar2;
    written = written + 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&output,written);
  ByteData::ByteData(__return_storage_ptr__,&output);
LAB_00351ef8:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const ByteData &signature, const SigHashType &sighash_type) {
  std::vector<uint8_t> sig = signature.GetBytes();
  // Secure the size considering SigHashType(1byte).
  std::vector<uint8_t> output(EC_SIGNATURE_DER_MAX_LEN + 1);
  size_t written = 0;

  if ((output.size() - 2) <= sig.size()) {
    try {
      SigHashType temp_sighash;
      ConvertSignatureFromDer(signature, &temp_sighash);
      uint8_t flag = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
      if (flag == temp_sighash.GetSigHashFlag()) {
        return signature;
      }
    } catch (const CfdException &except) {
      info(
          CFD_LOG_SOURCE, "ConvertSignatureFromDer fail. fall through. ({})",
          std::string(except.what()));
    }
  }

  // Convert a compact signature to DER encoding.
  int ret = wally_ec_sig_to_der(
      sig.data(), sig.size(), output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_to_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der encode error.");
  }

  if (written <= EC_SIGNATURE_DER_MAX_LEN) {
    // add SigHashType
    info(
        CFD_LOG_SOURCE, "size[{}]. append[{}]", written,
        sighash_type.GetSigHashFlag());
    output[written] = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
    ++written;
  }
  output.resize(written);

  return ByteData(output);
}